

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O1

void TTD::JsSupport::ReadCodeFromFile
               (ThreadContext *threadContext,bool fromEvent,uint32 bodyId,bool isUtf8Source,
               byte *sourceBuffer,uint32 length)

{
  ThreadContextTTD *pTVar1;
  TTDOpenResourceStreamCallback p_Var2;
  size_t sVar3;
  bool bVar4;
  char cVar5;
  size_t sVar6;
  JsTTDStreamHandle pvVar7;
  char *pcVar8;
  undefined7 in_register_00000031;
  char local_98 [8];
  char asciiResourceName [64];
  size_t local_40;
  size_t readCount;
  byte byteOrderArray [3];
  
  pcVar8 = "";
  if ((int)CONCAT71(in_register_00000031,fromEvent) != 0) {
    pcVar8 = "_ld";
  }
  sprintf_s(local_98,0x40,"src%s_%I32u.js",pcVar8,(ulong)bodyId);
  pTVar1 = threadContext->TTDContext;
  p_Var2 = (pTVar1->TTDataIOInfo).pfOpenResourceStream;
  sVar3 = (pTVar1->TTDataIOInfo).ActiveTTUriLength;
  pcVar8 = (pTVar1->TTDataIOInfo).ActiveTTUri;
  sVar6 = strlen(local_98);
  pvVar7 = (*p_Var2)(sVar3,pcVar8,sVar6,local_98,true,false);
  if (pvVar7 == (JsTTDStreamHandle)0x0) {
    TTDAbort_unrecoverable_error("Failed to open code resource stream for reading.");
  }
  if (isUtf8Source) {
    readCount._6_1_ = '\0';
    readCount._4_2_ = 0;
    local_40 = 0;
    bVar4 = (*(pTVar1->TTDataIOInfo).pfReadBytesFromStream)
                      (pvVar7,(byte *)((long)&readCount + 4),3,&local_40);
    if (((!bVar4) || (local_40 != 3)) ||
       ((readCount._4_1_ != -0x11 || ((readCount._5_1_ != -0x45 || (readCount._6_1_ != -0x41))))))
    goto LAB_0093b076;
  }
  else {
    readCount._4_2_ = 0;
    local_40 = 0;
    bVar4 = (*(pTVar1->TTDataIOInfo).pfReadBytesFromStream)
                      (pvVar7,(byte *)((long)&readCount + 4),2,&local_40);
    if ((((!bVar4) || (local_40 != 2)) || (readCount._4_1_ != -1)) || (readCount._5_1_ != -2))
    goto LAB_0093b076;
  }
  local_40 = 0;
  cVar5 = (*(pTVar1->TTDataIOInfo).pfReadBytesFromStream)(pvVar7,sourceBuffer,(ulong)length);
  if ((cVar5 != '\0') && (local_40 == length)) {
    (*(pTVar1->TTDataIOInfo).pfFlushAndCloseStream)(pvVar7,true,false);
    return;
  }
LAB_0093b076:
  TTDAbort_unrecoverable_error("Read Failed!!!");
}

Assistant:

void ReadCodeFromFile(ThreadContext* threadContext, bool fromEvent, uint32 bodyId, bool isUtf8Source, byte* sourceBuffer, uint32 length)
        {
            char asciiResourceName[64];
            sprintf_s(asciiResourceName, 64, "src%s_%I32u.js", (fromEvent ? "_ld" : ""), bodyId);

            TTDataIOInfo& iofp = threadContext->TTDContext->TTDataIOInfo;
            JsTTDStreamHandle srcStream = iofp.pfOpenResourceStream(iofp.ActiveTTUriLength, iofp.ActiveTTUri, strlen(asciiResourceName), asciiResourceName, true, false);
            TTDAssert(srcStream != nullptr, "Failed to open code resource stream for reading.");

            if(isUtf8Source)
            {
                byte byteOrderArray[3] = { 0x0, 0x0, 0x0 };
                size_t byteOrderCount = 0;
                bool okBOC = iofp.pfReadBytesFromStream(srcStream, byteOrderArray, _countof(byteOrderArray), &byteOrderCount);
                TTDAssert(okBOC && byteOrderCount == _countof(byteOrderArray) && byteOrderArray[0] == 0xEF && byteOrderArray[1] == 0xBB && byteOrderArray[2] == 0xBF, "Read Failed!!!");
            }
            else
            {
                byte byteOrderArray[2] = { 0x0, 0x0 };
                size_t byteOrderCount = 0;
                bool okBOC = iofp.pfReadBytesFromStream(srcStream, byteOrderArray, _countof(byteOrderArray), &byteOrderCount);
                TTDAssert(okBOC && byteOrderCount == _countof(byteOrderArray) && byteOrderArray[0] == 0xFF && byteOrderArray[1] == 0xFE, "Read Failed!!!");
            }

            size_t readCount = 0;
            bool ok = iofp.pfReadBytesFromStream(srcStream, sourceBuffer, length, &readCount);
            TTDAssert(ok && readCount == length, "Read Failed!!!");

            iofp.pfFlushAndCloseStream(srcStream, true, false);
        }